

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

bool bssl::ssl_public_key_verify
               (SSL *ssl,Span<const_unsigned_char> signature,uint16_t sigalg,EVP_PKEY *pkey,
               Span<const_unsigned_char> in)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  env_md_ctx_st *peVar4;
  uchar *sig;
  size_t sig_len;
  uchar *data;
  size_t len;
  bool local_69;
  bool ok;
  undefined1 local_58 [8];
  ScopedEVP_MD_CTX ctx;
  EVP_PKEY *pkey_local;
  uint16_t sigalg_local;
  SSL *ssl_local;
  Span<const_unsigned_char> signature_local;
  
  signature_local.data_ = (uchar *)signature.size_;
  ssl_local = (SSL *)signature.data_;
  ctx.ctx_.pctx_ops = (evp_md_pctx_ops *)pkey;
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_58);
  peVar4 = internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                  *)local_58);
  bVar1 = setup_ctx(ssl,peVar4,(EVP_PKEY *)ctx.ctx_.pctx_ops,sigalg,true);
  if (bVar1) {
    peVar4 = internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)local_58);
    sig = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
    sig_len = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
    data = Span<const_unsigned_char>::data(&in);
    len = Span<const_unsigned_char>::size(&in);
    iVar2 = EVP_DigestVerify(peVar4,sig,sig_len,data,len);
    iVar3 = CRYPTO_fuzzer_mode_enabled();
    if (iVar3 != 0) {
      ERR_clear_error();
    }
    local_69 = iVar3 != 0 || iVar2 != 0;
    signature_local.size_._7_1_ = local_69;
  }
  else {
    signature_local.size_._7_1_ = false;
  }
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_58);
  return (bool)(signature_local.size_._7_1_ & 1);
}

Assistant:

bool ssl_public_key_verify(SSL *ssl, Span<const uint8_t> signature,
                           uint16_t sigalg, EVP_PKEY *pkey,
                           Span<const uint8_t> in) {
  ScopedEVP_MD_CTX ctx;
  if (!setup_ctx(ssl, ctx.get(), pkey, sigalg, true /* verify */)) {
    return false;
  }
  bool ok = EVP_DigestVerify(ctx.get(), signature.data(), signature.size(),
                             in.data(), in.size());
  if (CRYPTO_fuzzer_mode_enabled()) {
    ok = true;
    ERR_clear_error();
  }
  return ok;
}